

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O1

Mig_Obj_t * Mig_ManAppendObj(Mig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 *__s;
  void **ppvVar4;
  Mig_Obj_t *pMVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  iVar8 = p->nObjs;
  if (iVar8 == 0x7fffffff) {
    __assert_fail("p->nObjs < MIG_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                  ,0xdc,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  uVar1 = (p->vPages).nSize;
  iVar6 = uVar1 * 0x1000;
  if (iVar8 < iVar6) goto LAB_00402410;
  if (iVar8 != iVar6) {
    __assert_fail("p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                  ,0xe0,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  __s = (undefined8 *)malloc(0x10020);
  memset(__s,0xff,0x10020);
  *__s = p;
  uVar2 = (p->vPages).nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar4 = (p->vPages).pArray;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,0x80);
      }
      (p->vPages).pArray = ppvVar4;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar2 * 2;
      if (iVar8 <= (int)uVar2) goto LAB_004023fe;
      ppvVar4 = (p->vPages).pArray;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar2 << 4);
      }
      (p->vPages).pArray = ppvVar4;
    }
    (p->vPages).nCap = iVar8;
  }
LAB_004023fe:
  iVar8 = (p->vPages).nSize;
  (p->vPages).nSize = iVar8 + 1;
  (p->vPages).pArray[iVar8] = __s + 2;
LAB_00402410:
  uVar1 = p->nObjs;
  p->nObjs = uVar1 + 1;
  if ((int)uVar1 < 0) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                  ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
  }
  if ((p->vPages).nSize <= (int)(uVar1 >> 0xc)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = (p->vPages).pArray[uVar1 >> 0xc];
  uVar7 = (ulong)((uVar1 & 0xfff) << 4);
  uVar2 = *(uint *)((long)pvVar3 + uVar7 + 0xc);
  if (uVar2 < 0xfffffffe) {
    __assert_fail("Mig_ObjIsNone(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                  ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  if (uVar1 != 0x7fffffff) {
    pMVar5 = (Mig_Obj_t *)((long)pvVar3 + uVar7);
    pMVar5->pFans[3] = (Mig_Fan_t)((uVar2 & 1) + uVar1 * 2);
    return pMVar5;
  }
  __assert_fail("v >= 0 && v < MIG_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                ,0x81,"int Mig_FanSetId(Mig_Obj_t *, int, int)");
}

Assistant:

static inline Mig_Obj_t * Mig_ManAppendObj( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    assert( p->nObjs < MIG_NONE );
    if ( p->nObjs >= (Vec_PtrSize(&p->vPages) << MIG_BASE) )
    {
        Mig_Obj_t * pPage;// int i;
        assert( p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE) );
        pPage = ABC_FALLOC( Mig_Obj_t, MIG_MASK + 3 ); // 1 for mask, 1 for prefix, 1 for sentinel
        *((void **)pPage) = p;
//        *((void ***)(pPage + 1) - 1) = Vec_PtrArray(&p->vPages);
        Vec_PtrPush( &p->vPages, pPage + 1 );
//        if ( *((void ***)(pPage + 1) - 1) != Vec_PtrArray(&p->vPages) )
//            Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, pPage, i )
//                *((void ***)pPage - 1) = Vec_PtrArray(&p->vPages);
    }
    pObj = Mig_ManObj( p, p->nObjs++ );
    assert( Mig_ObjIsNone(pObj) );
    Mig_ObjSetId( pObj, p->nObjs-1 );
    return pObj;
}